

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_3000_3999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case3103(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Expectation *pEVar2;
  socklen_t in_ECX;
  allocator<char> local_503;
  allocator<char> local_502;
  allocator<char> local_501;
  string local_500;
  string local_4e0;
  string local_4c0 [32];
  Expectation local_4a0;
  Expectation local_3e8;
  Decl local_330;
  Decl local_268;
  Decl local_1a0;
  Decl local_d8;
  
  std::__cxx11::string::string<std::allocator<char>>(local_4c0,"typedef int x , y ;",&local_501);
  Expectation::Expectation(&local_4a0);
  Decl::Decl(&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"x",&local_502);
  pDVar1 = Decl::Type(&local_1a0,&local_4e0);
  pDVar1 = Decl::inNameSpace(pDVar1,OrdinaryIdentifiers);
  pDVar1 = Decl::withScopeKind(pDVar1,File);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  Decl::Decl(&local_d8,pDVar1);
  pEVar2 = Expectation::declaration(&local_4a0,&local_d8);
  Decl::Decl(&local_330);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"y",&local_503);
  pDVar1 = Decl::Type(&local_330,&local_500);
  pDVar1 = Decl::inNameSpace(pDVar1,OrdinaryIdentifiers);
  pDVar1 = Decl::withScopeKind(pDVar1,File);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  Decl::Decl(&local_268,pDVar1);
  pEVar2 = Expectation::declaration(pEVar2,&local_268);
  Expectation::Expectation(&local_3e8,pEVar2);
  bind(this,(int)local_4c0,(sockaddr *)&local_3e8,in_ECX);
  Expectation::~Expectation(&local_3e8);
  Decl::~Decl(&local_268);
  std::__cxx11::string::~string((string *)&local_500);
  Decl::~Decl(&local_330);
  Decl::~Decl(&local_d8);
  std::__cxx11::string::~string((string *)&local_4e0);
  Decl::~Decl(&local_1a0);
  Expectation::~Expectation(&local_4a0);
  std::__cxx11::string::~string(local_4c0);
  return;
}

Assistant:

void DeclarationBinderTester::case3103()
{
    bind("typedef int x , y ;",
         Expectation()
             .declaration(Decl()
                          .Type("x")
                          .inNameSpace(NameSpace::OrdinaryIdentifiers)
                          .withScopeKind(ScopeKind::File)
                          .ty_.Basic(BasicTypeKind::Int_S))
             .declaration(Decl()
                          .Type("y")
                          .inNameSpace(NameSpace::OrdinaryIdentifiers)
                          .withScopeKind(ScopeKind::File)
                          .ty_.Basic(BasicTypeKind::Int_S)));
}